

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelNoClockAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::LoadSettings(SimpleParallelAnalyzerSettings *this,char *settings)

{
  size_type sVar1;
  reference pvVar2;
  reference this_00;
  Channel local_88 [16];
  char local_78 [8];
  char text [64];
  U32 i_1;
  U32 i;
  U32 count;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  SimpleParallelAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  sVar1 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mDataChannels);
  text[0x3c] = '\0';
  text[0x3d] = '\0';
  text[0x3e] = '\0';
  text[0x3f] = '\0';
  for (; (uint)text._60_4_ < (uint)sVar1; text._60_4_ = text._60_4_ + 1) {
    pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)(uint)text._60_4_);
    SimpleArchive::operator>>(local_20,pvVar2);
  }
  SimpleArchive::operator>>(local_20,&this->mClockChannel);
  SimpleArchive::operator>>(local_20,&this->mClockEdge);
  AnalyzerSettings::ClearChannels();
  text[0x38] = '\0';
  text[0x39] = '\0';
  text[0x3a] = '\0';
  text[0x3b] = '\0';
  for (; (uint)text._56_4_ < (uint)sVar1; text._56_4_ = text._56_4_ + 1) {
    sprintf(local_78,"D%d",(ulong)(uint)text._56_4_);
    pvVar2 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                       (&this->mDataChannels,(ulong)(uint)text._56_4_);
    this_00 = std::vector<Channel,_std::allocator<Channel>_>::operator[]
                        (&this->mDataChannels,(ulong)(uint)text._56_4_);
    Channel::Channel(local_88,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
    Channel::operator!=(this_00,local_88);
    AnalyzerSettings::AddChannel((Channel *)this,(char *)pvVar2,SUB81(local_78,0));
    Channel::~Channel(local_88);
  }
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mClockChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::LoadSettings( const char* settings )
{
	SimpleArchive text_archive;
	text_archive.SetString( settings );

	U32 count = (U32)mDataChannels.size();

	for( U32 i=0; i<count; i++ )
	{
		text_archive >> mDataChannels[i];
	}

	text_archive >> mClockChannel;
	text_archive >> *(U32*)&mClockEdge;

	ClearChannels();
	for( U32 i=0; i<count; i++ )
	{
		char text[64];
		sprintf( text, "D%d", i );
		AddChannel( mDataChannels[i], text, mDataChannels[i] != UNDEFINED_CHANNEL );
	}

	AddChannel( mClockChannel, "Clock", true );

	UpdateInterfacesFromSettings();
}